

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:515:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:515:17)>
             *this)

{
  AutoCloseFd *pAVar1;
  int (*paiVar2) [2];
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  char c;
  Fault f_1;
  AutoCloseFd clientFd;
  socklen_t caddrLen;
  sockaddr_in caddr;
  char local_69;
  Fault local_68;
  AutoCloseFd local_60;
  char local_58 [28];
  socklen_t local_3c;
  sockaddr local_38;
  
  local_3c = 0x10;
  pAVar1 = (this->f).serverFd;
  do {
    iVar3 = accept(pAVar1->fd,&local_38,&local_3c);
    if (-1 < iVar3) goto LAB_001dee73;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_60.fd = 0;
    local_60.unwindDetector.uncaughtCount = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    _::Debug::Fault::init
              ((Fault *)&local_60,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_60);
  }
LAB_001dee73:
  local_60.fd = iVar3;
  UnwindDetector::UnwindDetector(&local_60.unwindDetector);
  usleep(10000);
  local_69 = 'i';
  do {
    sVar5 = ::send(local_60.fd,&local_69,1,0);
    if (-1 < sVar5) goto LAB_001deebf;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_68.exception = (Exception *)0x0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    _::Debug::Fault::init
              (&local_68,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal(&local_68);
  }
LAB_001deebf:
  local_69 = 'o';
  do {
    sVar5 = ::send(local_60.fd,&local_69,1,1);
    if (-1 < sVar5) goto LAB_001def2f;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    if (iVar3 != 0x16) {
      local_68.exception = (Exception *)0x0;
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      _::Debug::Fault::init
                (&local_68,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      _::Debug::Fault::fatal(&local_68);
    }
    paiVar2 = (this->f).failpipe;
    do {
      sVar5 = ::write((*paiVar2)[1],&local_69,1);
      if (-1 < sVar5) goto LAB_001def2f;
      iVar3 = _::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      local_68.exception = (Exception *)0x0;
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      _::Debug::Fault::init
                (&local_68,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      _::Debug::Fault::fatal(&local_68);
    }
  }
LAB_001def2f:
  do {
    sVar5 = recv(local_60.fd,&local_69,1,0);
    if (-1 < sVar5) goto LAB_001def60;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_68.exception = (Exception *)0x0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    _::Debug::Fault::init
              (&local_68,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal(&local_68);
  }
LAB_001def60:
  if ((local_69 != 'q') && (_::Debug::minSeverity < 3)) {
    local_58[0] = 0x71;
    _::Debug::log<char_const(&)[30],char,char&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x21b,ERROR,"\"failed: expected \" \"(\'q\') == (c)\", \'q\', c",
               (char (*) [30])"failed: expected (\'q\') == (c)",local_58,&local_69);
  }
  AutoCloseFd::~AutoCloseFd(&local_60);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }